

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RTCFilterFunctionN p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  Geometry *pGVar25;
  Scene *pSVar26;
  long lVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar69;
  undefined1 auVar67 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [16];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1689;
  RayK<8> *local_1688;
  undefined8 local_1680;
  float fStack_1678;
  float fStack_1674;
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  undefined1 local_1620 [16];
  Scene *local_1610;
  undefined8 uStack_1608;
  undefined1 local_1600 [16];
  undefined1 local_15f0 [16];
  long local_15e0;
  ulong local_15d8;
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  float local_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined1 *local_1520;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined4 local_1280;
  undefined4 uStack_127c;
  undefined4 uStack_1278;
  undefined4 uStack_1274;
  undefined4 uStack_1270;
  undefined4 uStack_126c;
  undefined4 uStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  puVar28 = local_11f8;
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar67 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar77 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar79 = ZEXT3264(CONCAT428(uVar1,CONCAT424(uVar1,CONCAT420(uVar1,CONCAT416(uVar1,CONCAT412(uVar1
                                                  ,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))))))));
  local_1420 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1440 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1460 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_13c0 = local_1420 * 0.99999964;
  local_13e0 = local_1440 * 0.99999964;
  local_1400 = local_1460 * 0.99999964;
  local_1420 = local_1420 * 1.0000004;
  local_1440 = local_1440 * 1.0000004;
  local_1460 = local_1460 * 1.0000004;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_15d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar30 = uVar29 ^ 0x20;
  uVar32 = local_15d8 ^ 0x20;
  iVar19 = (tray->tnear).field_0.i[k];
  auVar87 = ZEXT3264(CONCAT428(iVar19,CONCAT424(iVar19,CONCAT420(iVar19,CONCAT416(iVar19,CONCAT412(
                                                  iVar19,CONCAT48(iVar19,CONCAT44(iVar19,iVar19)))))
                                               )));
  iVar19 = (tray->tfar).field_0.i[k];
  auVar89 = ZEXT3264(CONCAT428(iVar19,CONCAT424(iVar19,CONCAT420(iVar19,CONCAT416(iVar19,CONCAT412(
                                                  iVar19,CONCAT48(iVar19,CONCAT44(iVar19,iVar19)))))
                                               )));
  iVar19 = 1 << ((uint)k & 0x1f);
  auVar41._4_4_ = iVar19;
  auVar41._0_4_ = iVar19;
  auVar41._8_4_ = iVar19;
  auVar41._12_4_ = iVar19;
  auVar41._16_4_ = iVar19;
  auVar41._20_4_ = iVar19;
  auVar41._24_4_ = iVar19;
  auVar41._28_4_ = iVar19;
  auVar13 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar41 = vpand_avx2(auVar41,auVar13);
  local_1340 = vpcmpeqd_avx2(auVar41,auVar13);
  bVar34 = true;
  fStack_145c = local_1460;
  fStack_1458 = local_1460;
  fStack_1454 = local_1460;
  fStack_1450 = local_1460;
  fStack_144c = local_1460;
  fStack_1448 = local_1460;
  fStack_1444 = local_1460;
  fStack_13dc = local_13e0;
  fStack_13d8 = local_13e0;
  fStack_13d4 = local_13e0;
  fStack_13d0 = local_13e0;
  fStack_13cc = local_13e0;
  fStack_13c8 = local_13e0;
  fStack_13c4 = local_13e0;
  fStack_13bc = local_13c0;
  fStack_13b8 = local_13c0;
  fStack_13b4 = local_13c0;
  fStack_13b0 = local_13c0;
  fStack_13ac = local_13c0;
  fStack_13a8 = local_13c0;
  fStack_13a4 = local_13c0;
  fStack_13fc = local_1400;
  fStack_13f8 = local_1400;
  fStack_13f4 = local_1400;
  fStack_13f0 = local_1400;
  fStack_13ec = local_1400;
  fStack_13e8 = local_1400;
  fStack_13e4 = local_1400;
  fStack_141c = local_1420;
  fStack_1418 = local_1420;
  fStack_1414 = local_1420;
  fStack_1410 = local_1420;
  fStack_140c = local_1420;
  fStack_1408 = local_1420;
  fStack_1404 = local_1420;
  fStack_143c = local_1440;
  fStack_1438 = local_1440;
  fStack_1434 = local_1440;
  fStack_1430 = local_1440;
  fStack_142c = local_1440;
  fStack_1428 = local_1440;
  fStack_1424 = local_1440;
  local_1688 = ray;
  do {
    uVar31 = puVar28[-1];
    puVar28 = puVar28 + -1;
    local_1360 = auVar67._0_32_;
    local_1380 = auVar77._0_32_;
    local_13a0 = auVar79._0_32_;
    while ((uVar31 & 8) == 0) {
      auVar41 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar29),local_1360);
      auVar13._4_4_ = fStack_13bc * auVar41._4_4_;
      auVar13._0_4_ = local_13c0 * auVar41._0_4_;
      auVar13._8_4_ = fStack_13b8 * auVar41._8_4_;
      auVar13._12_4_ = fStack_13b4 * auVar41._12_4_;
      auVar13._16_4_ = fStack_13b0 * auVar41._16_4_;
      auVar13._20_4_ = fStack_13ac * auVar41._20_4_;
      auVar13._24_4_ = fStack_13a8 * auVar41._24_4_;
      auVar13._28_4_ = auVar41._28_4_;
      auVar41 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + local_15d8),local_1380);
      auVar12._4_4_ = fStack_13dc * auVar41._4_4_;
      auVar12._0_4_ = local_13e0 * auVar41._0_4_;
      auVar12._8_4_ = fStack_13d8 * auVar41._8_4_;
      auVar12._12_4_ = fStack_13d4 * auVar41._12_4_;
      auVar12._16_4_ = fStack_13d0 * auVar41._16_4_;
      auVar12._20_4_ = fStack_13cc * auVar41._20_4_;
      auVar12._24_4_ = fStack_13c8 * auVar41._24_4_;
      auVar12._28_4_ = auVar41._28_4_;
      auVar41 = vmaxps_avx(auVar13,auVar12);
      auVar13 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar23),local_13a0);
      auVar15._4_4_ = fStack_13fc * auVar13._4_4_;
      auVar15._0_4_ = local_1400 * auVar13._0_4_;
      auVar15._8_4_ = fStack_13f8 * auVar13._8_4_;
      auVar15._12_4_ = fStack_13f4 * auVar13._12_4_;
      auVar15._16_4_ = fStack_13f0 * auVar13._16_4_;
      auVar15._20_4_ = fStack_13ec * auVar13._20_4_;
      auVar15._24_4_ = fStack_13e8 * auVar13._24_4_;
      auVar15._28_4_ = auVar13._28_4_;
      auVar13 = vmaxps_avx(auVar15,auVar87._0_32_);
      auVar41 = vmaxps_avx(auVar41,auVar13);
      auVar13 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar30),local_1360);
      auVar16._4_4_ = fStack_141c * auVar13._4_4_;
      auVar16._0_4_ = local_1420 * auVar13._0_4_;
      auVar16._8_4_ = fStack_1418 * auVar13._8_4_;
      auVar16._12_4_ = fStack_1414 * auVar13._12_4_;
      auVar16._16_4_ = fStack_1410 * auVar13._16_4_;
      auVar16._20_4_ = fStack_140c * auVar13._20_4_;
      auVar16._24_4_ = fStack_1408 * auVar13._24_4_;
      auVar16._28_4_ = auVar13._28_4_;
      auVar13 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + uVar32),local_1380);
      auVar17._4_4_ = fStack_143c * auVar13._4_4_;
      auVar17._0_4_ = local_1440 * auVar13._0_4_;
      auVar17._8_4_ = fStack_1438 * auVar13._8_4_;
      auVar17._12_4_ = fStack_1434 * auVar13._12_4_;
      auVar17._16_4_ = fStack_1430 * auVar13._16_4_;
      auVar17._20_4_ = fStack_142c * auVar13._20_4_;
      auVar17._24_4_ = fStack_1428 * auVar13._24_4_;
      auVar17._28_4_ = auVar13._28_4_;
      auVar13 = vminps_avx(auVar16,auVar17);
      auVar12 = vsubps_avx(*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar23 ^ 0x20)),local_13a0);
      auVar18._4_4_ = fStack_145c * auVar12._4_4_;
      auVar18._0_4_ = local_1460 * auVar12._0_4_;
      auVar18._8_4_ = fStack_1458 * auVar12._8_4_;
      auVar18._12_4_ = fStack_1454 * auVar12._12_4_;
      auVar18._16_4_ = fStack_1450 * auVar12._16_4_;
      auVar18._20_4_ = fStack_144c * auVar12._20_4_;
      auVar18._24_4_ = fStack_1448 * auVar12._24_4_;
      auVar18._28_4_ = auVar12._28_4_;
      auVar12 = vminps_avx(auVar18,auVar89._0_32_);
      auVar13 = vminps_avx(auVar13,auVar12);
      auVar41 = vcmpps_avx(auVar41,auVar13,2);
      uVar21 = vmovmskps_avx(auVar41);
      if (uVar21 == 0) goto LAB_00624254;
      uVar21 = uVar21 & 0xff;
      uVar20 = uVar31 & 0xfffffffffffffff0;
      lVar27 = 0;
      for (uVar31 = (ulong)uVar21; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar31 = *(ulong *)(uVar20 + lVar27 * 8);
      uVar21 = uVar21 - 1 & uVar21;
      uVar24 = (ulong)uVar21;
      if (uVar21 != 0) {
        *puVar28 = uVar31;
        lVar27 = 0;
        for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar21 = uVar21 - 1 & uVar21;
        uVar24 = (ulong)uVar21;
        bVar33 = uVar21 == 0;
        while( true ) {
          puVar28 = puVar28 + 1;
          uVar31 = *(ulong *)(uVar20 + lVar27 * 8);
          if (bVar33) break;
          *puVar28 = uVar31;
          lVar27 = 0;
          for (uVar31 = uVar24; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar24 = uVar24 - 1 & uVar24;
          bVar33 = uVar24 == 0;
        }
      }
    }
    lVar27 = (ulong)((uint)uVar31 & 0xf) - 8;
    if (lVar27 != 0) {
      uVar31 = uVar31 & 0xfffffffffffffff0;
      local_15e0 = 0;
      local_1480 = auVar87._0_32_;
      local_14a0 = auVar89._0_32_;
      do {
        lVar22 = local_15e0 * 0xb0;
        uVar1 = *(undefined4 *)(local_1688 + k * 4);
        auVar35._4_4_ = uVar1;
        auVar35._0_4_ = uVar1;
        auVar35._8_4_ = uVar1;
        auVar35._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(local_1688 + k * 4 + 0x20);
        auVar46._4_4_ = uVar1;
        auVar46._0_4_ = uVar1;
        auVar46._8_4_ = uVar1;
        auVar46._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(local_1688 + k * 4 + 0x40);
        auVar53._4_4_ = uVar1;
        auVar53._0_4_ = uVar1;
        auVar53._8_4_ = uVar1;
        auVar53._12_4_ = uVar1;
        local_15f0 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + lVar22),auVar35);
        local_1600 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x10 + lVar22),auVar46);
        local_1620 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x20 + lVar22),auVar53);
        auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x30 + lVar22),auVar35);
        auVar63 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x40 + lVar22),auVar46);
        auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x50 + lVar22),auVar53);
        auVar35 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x60 + lVar22),auVar35);
        auVar46 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x70 + lVar22),auVar46);
        auVar48 = vsubps_avx(*(undefined1 (*) [16])(uVar31 + 0x80 + lVar22),auVar53);
        local_1630 = vsubps_avx(auVar35,local_15f0);
        local_1650 = vsubps_avx(auVar46,local_1600);
        local_1640 = vsubps_avx(auVar48,local_1620);
        auVar36._0_4_ = local_15f0._0_4_ + auVar35._0_4_;
        auVar36._4_4_ = local_15f0._4_4_ + auVar35._4_4_;
        auVar36._8_4_ = local_15f0._8_4_ + auVar35._8_4_;
        auVar36._12_4_ = local_15f0._12_4_ + auVar35._12_4_;
        auVar54._0_4_ = local_1600._0_4_ + auVar46._0_4_;
        auVar54._4_4_ = local_1600._4_4_ + auVar46._4_4_;
        auVar54._8_4_ = local_1600._8_4_ + auVar46._8_4_;
        auVar54._12_4_ = local_1600._12_4_ + auVar46._12_4_;
        fVar62 = local_1620._0_4_;
        auVar56._0_4_ = fVar62 + auVar48._0_4_;
        fVar68 = local_1620._4_4_;
        auVar56._4_4_ = fVar68 + auVar48._4_4_;
        fVar69 = local_1620._8_4_;
        auVar56._8_4_ = fVar69 + auVar48._8_4_;
        fVar70 = local_1620._12_4_;
        auVar56._12_4_ = fVar70 + auVar48._12_4_;
        auVar88._0_4_ = local_1640._0_4_ * auVar54._0_4_;
        auVar88._4_4_ = local_1640._4_4_ * auVar54._4_4_;
        auVar88._8_4_ = local_1640._8_4_ * auVar54._8_4_;
        auVar88._12_4_ = local_1640._12_4_ * auVar54._12_4_;
        auVar71 = vfmsub231ps_fma(auVar88,local_1650,auVar56);
        auVar57._0_4_ = auVar56._0_4_ * local_1630._0_4_;
        auVar57._4_4_ = auVar56._4_4_ * local_1630._4_4_;
        auVar57._8_4_ = auVar56._8_4_ * local_1630._8_4_;
        auVar57._12_4_ = auVar56._12_4_ * local_1630._12_4_;
        auVar53 = vfmsub231ps_fma(auVar57,local_1640,auVar36);
        auVar37._0_4_ = local_1650._0_4_ * auVar36._0_4_;
        auVar37._4_4_ = local_1650._4_4_ * auVar36._4_4_;
        auVar37._8_4_ = local_1650._8_4_ * auVar36._8_4_;
        auVar37._12_4_ = local_1650._12_4_ * auVar36._12_4_;
        auVar36 = vfmsub231ps_fma(auVar37,local_1630,auVar54);
        local_1680._4_4_ = *(float *)(local_1688 + k * 4 + 0xc0);
        auVar38._0_4_ = local_1680._4_4_ * auVar36._0_4_;
        auVar38._4_4_ = local_1680._4_4_ * auVar36._4_4_;
        auVar38._8_4_ = local_1680._4_4_ * auVar36._8_4_;
        auVar38._12_4_ = local_1680._4_4_ * auVar36._12_4_;
        uVar1 = *(undefined4 *)(local_1688 + k * 4 + 0xa0);
        auVar78._4_4_ = uVar1;
        auVar78._0_4_ = uVar1;
        auVar78._8_4_ = uVar1;
        auVar78._12_4_ = uVar1;
        auVar53 = vfmadd231ps_fma(auVar38,auVar78,auVar53);
        uVar1 = *(undefined4 *)(local_1688 + k * 4 + 0x80);
        auVar94._4_4_ = uVar1;
        auVar94._0_4_ = uVar1;
        auVar94._8_4_ = uVar1;
        auVar94._12_4_ = uVar1;
        local_1570 = vfmadd231ps_fma(auVar53,auVar94,auVar71);
        auVar53 = vsubps_avx(local_1600,auVar63);
        local_1560 = vsubps_avx(local_1620,auVar43);
        auVar55._0_4_ = local_1600._0_4_ + auVar63._0_4_;
        auVar55._4_4_ = local_1600._4_4_ + auVar63._4_4_;
        auVar55._8_4_ = local_1600._8_4_ + auVar63._8_4_;
        auVar55._12_4_ = local_1600._12_4_ + auVar63._12_4_;
        auVar58._0_4_ = fVar62 + auVar43._0_4_;
        auVar58._4_4_ = fVar68 + auVar43._4_4_;
        auVar58._8_4_ = fVar69 + auVar43._8_4_;
        auVar58._12_4_ = fVar70 + auVar43._12_4_;
        fVar90 = local_1560._0_4_;
        auVar71._0_4_ = fVar90 * auVar55._0_4_;
        fVar91 = local_1560._4_4_;
        auVar71._4_4_ = fVar91 * auVar55._4_4_;
        fVar92 = local_1560._8_4_;
        auVar71._8_4_ = fVar92 * auVar55._8_4_;
        fVar93 = local_1560._12_4_;
        auVar71._12_4_ = fVar93 * auVar55._12_4_;
        auVar37 = vfmsub231ps_fma(auVar71,auVar53,auVar58);
        auVar71 = vsubps_avx(local_15f0,auVar42);
        fVar4 = auVar71._0_4_;
        auVar80._0_4_ = auVar58._0_4_ * fVar4;
        fVar6 = auVar71._4_4_;
        auVar80._4_4_ = auVar58._4_4_ * fVar6;
        fVar8 = auVar71._8_4_;
        auVar80._8_4_ = auVar58._8_4_ * fVar8;
        fVar10 = auVar71._12_4_;
        auVar80._12_4_ = auVar58._12_4_ * fVar10;
        auVar59._0_4_ = local_15f0._0_4_ + auVar42._0_4_;
        auVar59._4_4_ = local_15f0._4_4_ + auVar42._4_4_;
        auVar59._8_4_ = local_15f0._8_4_ + auVar42._8_4_;
        auVar59._12_4_ = local_15f0._12_4_ + auVar42._12_4_;
        auVar36 = vfmsub231ps_fma(auVar80,local_1560,auVar59);
        fVar5 = auVar53._0_4_;
        auVar60._0_4_ = auVar59._0_4_ * fVar5;
        fVar7 = auVar53._4_4_;
        auVar60._4_4_ = auVar59._4_4_ * fVar7;
        fVar9 = auVar53._8_4_;
        auVar60._8_4_ = auVar59._8_4_ * fVar9;
        fVar11 = auVar53._12_4_;
        auVar60._12_4_ = auVar59._12_4_ * fVar11;
        auVar38 = vfmsub231ps_fma(auVar60,auVar71,auVar55);
        auVar61._0_4_ = local_1680._4_4_ * auVar38._0_4_;
        auVar61._4_4_ = local_1680._4_4_ * auVar38._4_4_;
        auVar61._8_4_ = local_1680._4_4_ * auVar38._8_4_;
        auVar61._12_4_ = local_1680._4_4_ * auVar38._12_4_;
        auVar36 = vfmadd231ps_fma(auVar61,auVar78,auVar36);
        local_1540 = vfmadd231ps_fma(auVar36,auVar94,auVar37);
        auVar36 = vsubps_avx(auVar42,auVar35);
        auVar72._0_4_ = auVar42._0_4_ + auVar35._0_4_;
        auVar72._4_4_ = auVar42._4_4_ + auVar35._4_4_;
        auVar72._8_4_ = auVar42._8_4_ + auVar35._8_4_;
        auVar72._12_4_ = auVar42._12_4_ + auVar35._12_4_;
        auVar35 = vsubps_avx(auVar63,auVar46);
        auVar47._0_4_ = auVar63._0_4_ + auVar46._0_4_;
        auVar47._4_4_ = auVar63._4_4_ + auVar46._4_4_;
        auVar47._8_4_ = auVar63._8_4_ + auVar46._8_4_;
        auVar47._12_4_ = auVar63._12_4_ + auVar46._12_4_;
        auVar46 = vsubps_avx(auVar43,auVar48);
        auVar42._0_4_ = auVar43._0_4_ + auVar48._0_4_;
        auVar42._4_4_ = auVar43._4_4_ + auVar48._4_4_;
        auVar42._8_4_ = auVar43._8_4_ + auVar48._8_4_;
        auVar42._12_4_ = auVar43._12_4_ + auVar48._12_4_;
        auVar63._0_4_ = auVar46._0_4_ * auVar47._0_4_;
        auVar63._4_4_ = auVar46._4_4_ * auVar47._4_4_;
        auVar63._8_4_ = auVar46._8_4_ * auVar47._8_4_;
        auVar63._12_4_ = auVar46._12_4_ * auVar47._12_4_;
        auVar63 = vfmsub231ps_fma(auVar63,auVar35,auVar42);
        auVar43._0_4_ = auVar42._0_4_ * auVar36._0_4_;
        auVar43._4_4_ = auVar42._4_4_ * auVar36._4_4_;
        auVar43._8_4_ = auVar42._8_4_ * auVar36._8_4_;
        auVar43._12_4_ = auVar42._12_4_ * auVar36._12_4_;
        auVar42 = vfmsub231ps_fma(auVar43,auVar46,auVar72);
        auVar73._0_4_ = auVar35._0_4_ * auVar72._0_4_;
        auVar73._4_4_ = auVar35._4_4_ * auVar72._4_4_;
        auVar73._8_4_ = auVar35._8_4_ * auVar72._8_4_;
        auVar73._12_4_ = auVar35._12_4_ * auVar72._12_4_;
        auVar43 = vfmsub231ps_fma(auVar73,auVar36,auVar47);
        local_1680._0_4_ = local_1680._4_4_;
        fStack_1678 = local_1680._4_4_;
        fStack_1674 = local_1680._4_4_;
        auVar48._0_4_ = local_1680._4_4_ * auVar43._0_4_;
        auVar48._4_4_ = local_1680._4_4_ * auVar43._4_4_;
        auVar48._8_4_ = local_1680._4_4_ * auVar43._8_4_;
        auVar48._12_4_ = local_1680._4_4_ * auVar43._12_4_;
        auVar42 = vfmadd231ps_fma(auVar48,auVar78,auVar42);
        auVar43 = vfmadd231ps_fma(auVar42,auVar94,auVar63);
        local_1550 = local_1570._0_4_;
        fStack_154c = local_1570._4_4_;
        fStack_1548 = local_1570._8_4_;
        fStack_1544 = local_1570._12_4_;
        local_1530._0_4_ = auVar43._0_4_ + local_1540._0_4_ + local_1550;
        local_1530._4_4_ = auVar43._4_4_ + local_1540._4_4_ + fStack_154c;
        local_1530._8_4_ = auVar43._8_4_ + local_1540._8_4_ + fStack_1548;
        local_1530._12_4_ = auVar43._12_4_ + local_1540._12_4_ + fStack_1544;
        auVar64._8_4_ = 0x7fffffff;
        auVar64._0_8_ = 0x7fffffff7fffffff;
        auVar64._12_4_ = 0x7fffffff;
        auVar42 = vminps_avx(local_1570,local_1540);
        auVar42 = vminps_avx(auVar42,auVar43);
        local_1580 = vandps_avx(local_1530,auVar64);
        auVar81._0_4_ = local_1580._0_4_ * 1.1920929e-07;
        auVar81._4_4_ = local_1580._4_4_ * 1.1920929e-07;
        auVar81._8_4_ = local_1580._8_4_ * 1.1920929e-07;
        auVar81._12_4_ = local_1580._12_4_ * 1.1920929e-07;
        uVar20 = CONCAT44(auVar81._4_4_,auVar81._0_4_);
        auVar74._0_8_ = uVar20 ^ 0x8000000080000000;
        auVar74._8_4_ = -auVar81._8_4_;
        auVar74._12_4_ = -auVar81._12_4_;
        auVar42 = vcmpps_avx(auVar42,auVar74,5);
        auVar63 = vmaxps_avx(local_1570,local_1540);
        auVar63 = vmaxps_avx(auVar63,auVar43);
        auVar63 = vcmpps_avx(auVar63,auVar81,2);
        local_1670 = vorps_avx(auVar42,auVar63);
        if ((((local_1670 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_1670 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_1670 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_1670[0xf] < '\0') {
          auVar44._0_4_ = fVar5 * local_1640._0_4_;
          auVar44._4_4_ = fVar7 * local_1640._4_4_;
          auVar44._8_4_ = fVar9 * local_1640._8_4_;
          auVar44._12_4_ = fVar11 * local_1640._12_4_;
          auVar75._0_4_ = fVar4 * local_1650._0_4_;
          auVar75._4_4_ = fVar6 * local_1650._4_4_;
          auVar75._8_4_ = fVar8 * local_1650._8_4_;
          auVar75._12_4_ = fVar10 * local_1650._12_4_;
          auVar43 = vfmsub213ps_fma(local_1650,local_1560,auVar44);
          auVar49._0_4_ = fVar90 * auVar35._0_4_;
          auVar49._4_4_ = fVar91 * auVar35._4_4_;
          auVar49._8_4_ = fVar92 * auVar35._8_4_;
          auVar49._12_4_ = fVar93 * auVar35._12_4_;
          auVar82._0_4_ = fVar4 * auVar46._0_4_;
          auVar82._4_4_ = fVar6 * auVar46._4_4_;
          auVar82._8_4_ = fVar8 * auVar46._8_4_;
          auVar82._12_4_ = fVar10 * auVar46._12_4_;
          auVar46 = vfmsub213ps_fma(auVar46,auVar53,auVar49);
          auVar42 = vandps_avx(auVar44,auVar64);
          auVar63 = vandps_avx(auVar49,auVar64);
          auVar42 = vcmpps_avx(auVar42,auVar63,1);
          local_14d0 = vblendvps_avx(auVar46,auVar43,auVar42);
          auVar84._0_4_ = fVar5 * auVar36._0_4_;
          auVar84._4_4_ = fVar7 * auVar36._4_4_;
          auVar84._8_4_ = fVar9 * auVar36._8_4_;
          auVar84._12_4_ = fVar11 * auVar36._12_4_;
          auVar43 = vfmsub213ps_fma(auVar36,local_1560,auVar82);
          auVar50._0_4_ = fVar90 * local_1630._0_4_;
          auVar50._4_4_ = fVar91 * local_1630._4_4_;
          auVar50._8_4_ = fVar92 * local_1630._8_4_;
          auVar50._12_4_ = fVar93 * local_1630._12_4_;
          auVar46 = vfmsub213ps_fma(local_1640,auVar71,auVar50);
          auVar42 = vandps_avx(auVar50,auVar64);
          auVar63 = vandps_avx(auVar82,auVar64);
          auVar42 = vcmpps_avx(auVar42,auVar63,1);
          local_14c0 = vblendvps_avx(auVar43,auVar46,auVar42);
          auVar43 = vfmsub213ps_fma(local_1630,auVar53,auVar75);
          auVar35 = vfmsub213ps_fma(auVar35,auVar71,auVar84);
          auVar42 = vandps_avx(auVar75,auVar64);
          auVar63 = vandps_avx(auVar84,auVar64);
          auVar42 = vcmpps_avx(auVar42,auVar63,1);
          local_14b0 = vblendvps_avx(auVar35,auVar43,auVar42);
          auVar65._0_4_ = local_14b0._0_4_ * local_1680._4_4_;
          auVar65._4_4_ = local_14b0._4_4_ * local_1680._4_4_;
          auVar65._8_4_ = local_14b0._8_4_ * local_1680._4_4_;
          auVar65._12_4_ = local_14b0._12_4_ * local_1680._4_4_;
          auVar42 = vfmadd213ps_fma(auVar78,local_14c0,auVar65);
          auVar42 = vfmadd213ps_fma(auVar94,local_14d0,auVar42);
          auVar76._0_4_ = auVar42._0_4_ + auVar42._0_4_;
          auVar76._4_4_ = auVar42._4_4_ + auVar42._4_4_;
          auVar76._8_4_ = auVar42._8_4_ + auVar42._8_4_;
          auVar76._12_4_ = auVar42._12_4_ + auVar42._12_4_;
          auVar66._0_4_ = local_14b0._0_4_ * fVar62;
          auVar66._4_4_ = local_14b0._4_4_ * fVar68;
          auVar66._8_4_ = local_14b0._8_4_ * fVar69;
          auVar66._12_4_ = local_14b0._12_4_ * fVar70;
          auVar42 = vfmadd213ps_fma(local_1600,local_14c0,auVar66);
          auVar63 = vfmadd213ps_fma(local_15f0,local_14d0,auVar42);
          auVar42 = vrcpps_avx(auVar76);
          auVar85._8_4_ = 0x3f800000;
          auVar85._0_8_ = 0x3f8000003f800000;
          auVar85._12_4_ = 0x3f800000;
          auVar43 = vfnmadd213ps_fma(auVar42,auVar76,auVar85);
          auVar42 = vfmadd132ps_fma(auVar43,auVar42,auVar42);
          local_14e0._0_4_ = auVar42._0_4_ * (auVar63._0_4_ + auVar63._0_4_);
          local_14e0._4_4_ = auVar42._4_4_ * (auVar63._4_4_ + auVar63._4_4_);
          local_14e0._8_4_ = auVar42._8_4_ * (auVar63._8_4_ + auVar63._8_4_);
          local_14e0._12_4_ = auVar42._12_4_ * (auVar63._12_4_ + auVar63._12_4_);
          uVar1 = *(undefined4 *)(local_1688 + k * 4 + 0x60);
          auVar83._4_4_ = uVar1;
          auVar83._0_4_ = uVar1;
          auVar83._8_4_ = uVar1;
          auVar83._12_4_ = uVar1;
          auVar42 = vcmpps_avx(auVar83,local_14e0,2);
          uVar1 = *(undefined4 *)(local_1688 + k * 4 + 0x100);
          auVar86._4_4_ = uVar1;
          auVar86._0_4_ = uVar1;
          auVar86._8_4_ = uVar1;
          auVar86._12_4_ = uVar1;
          auVar67 = ZEXT1664(auVar86);
          auVar63 = vcmpps_avx(local_14e0,auVar86,2);
          auVar42 = vandps_avx(auVar42,auVar63);
          auVar63 = local_1670 & auVar42;
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar63[0xf] < '\0') {
            auVar42 = vandps_avx(auVar42,local_1670);
            auVar63 = vcmpps_avx(auVar76,_DAT_01f7aa10,4);
            local_1510 = vandps_avx(auVar42,auVar63);
            uVar21 = vmovmskps_avx(local_1510);
            if (uVar21 != 0) {
              lVar22 = lVar22 + uVar31;
              local_1680 = lVar22;
              local_1520 = &local_1689;
              auVar42 = vrcpps_avx(local_1530);
              auVar51._8_4_ = 0x3f800000;
              auVar51._0_8_ = 0x3f8000003f800000;
              auVar51._12_4_ = 0x3f800000;
              auVar63 = vfnmadd213ps_fma(local_1530,auVar42,auVar51);
              auVar63 = vfmadd132ps_fma(auVar63,auVar42,auVar42);
              auVar45._8_4_ = 0x219392ef;
              auVar45._0_8_ = 0x219392ef219392ef;
              auVar45._12_4_ = 0x219392ef;
              auVar42 = vcmpps_avx(local_1580,auVar45,5);
              auVar42 = vandps_avx(auVar42,auVar63);
              auVar39._0_4_ = local_1550 * auVar42._0_4_;
              auVar39._4_4_ = fStack_154c * auVar42._4_4_;
              auVar39._8_4_ = fStack_1548 * auVar42._8_4_;
              auVar39._12_4_ = fStack_1544 * auVar42._12_4_;
              local_1500 = vminps_avx(auVar39,auVar51);
              auVar40._0_4_ = auVar42._0_4_ * local_1540._0_4_;
              auVar40._4_4_ = auVar42._4_4_ * local_1540._4_4_;
              auVar40._8_4_ = auVar42._8_4_ * local_1540._8_4_;
              auVar40._12_4_ = auVar42._12_4_ * local_1540._12_4_;
              local_14f0 = vminps_avx(auVar40,auVar51);
              uVar20 = (ulong)(uVar21 & 0xff);
              uStack_1608 = auVar94._8_8_;
              local_1610 = context->scene;
              pSVar26 = context->scene;
              do {
                uVar24 = 0;
                for (uVar14 = uVar20; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000)
                {
                  uVar24 = uVar24 + 1;
                }
                uVar21 = *(uint *)(lVar22 + 0x90 + uVar24 * 4);
                pGVar25 = (pSVar26->geometries).items[uVar21].ptr;
                if ((pGVar25->mask & *(uint *)(local_1688 + k * 4 + 0x120)) == 0) {
                  uVar20 = uVar20 ^ 1L << (uVar24 & 0x3f);
                  lVar22 = local_1680;
                }
                else {
                  local_1670._0_8_ = uVar24;
                  local_15f0._0_8_ = uVar20;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0062426a:
                    *(undefined4 *)(local_1688 + k * 4 + 0x100) = 0xff800000;
                    return bVar34;
                  }
                  local_1600._0_8_ = pGVar25;
                  uVar20 = (ulong)(uint)((int)uVar24 * 4);
                  local_12c0 = *(undefined4 *)(local_1500 + uVar20);
                  local_12a0 = *(undefined4 *)(local_14f0 + uVar20);
                  *(undefined4 *)(local_1688 + k * 4 + 0x100) = *(undefined4 *)(local_14e0 + uVar20)
                  ;
                  local_15d0.context = context->user;
                  local_1280 = *(undefined4 *)(local_1680 + 0xa0 + uVar20);
                  uVar1 = *(undefined4 *)(local_14d0 + uVar20);
                  uVar2 = *(undefined4 *)(local_14c0 + uVar20);
                  local_1300._4_4_ = uVar2;
                  local_1300._0_4_ = uVar2;
                  local_1300._8_4_ = uVar2;
                  local_1300._12_4_ = uVar2;
                  local_1300._16_4_ = uVar2;
                  local_1300._20_4_ = uVar2;
                  local_1300._24_4_ = uVar2;
                  local_1300._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_14b0 + uVar20);
                  local_12e0._4_4_ = uVar2;
                  local_12e0._0_4_ = uVar2;
                  local_12e0._8_4_ = uVar2;
                  local_12e0._12_4_ = uVar2;
                  local_12e0._16_4_ = uVar2;
                  local_12e0._20_4_ = uVar2;
                  local_12e0._24_4_ = uVar2;
                  local_12e0._28_4_ = uVar2;
                  local_1260._4_4_ = uVar21;
                  local_1260._0_4_ = uVar21;
                  local_1260._8_4_ = uVar21;
                  local_1260._12_4_ = uVar21;
                  local_1260._16_4_ = uVar21;
                  local_1260._20_4_ = uVar21;
                  local_1260._24_4_ = uVar21;
                  local_1260._28_4_ = uVar21;
                  local_1320[0] = (RTCHitN)(char)uVar1;
                  local_1320[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[4] = (RTCHitN)(char)uVar1;
                  local_1320[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[8] = (RTCHitN)(char)uVar1;
                  local_1320[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0xc] = (RTCHitN)(char)uVar1;
                  local_1320[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x10] = (RTCHitN)(char)uVar1;
                  local_1320[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x14] = (RTCHitN)(char)uVar1;
                  local_1320[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x18] = (RTCHitN)(char)uVar1;
                  local_1320[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_1320[0x1c] = (RTCHitN)(char)uVar1;
                  local_1320[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_1320[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_1320[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_12bc = local_12c0;
                  uStack_12b8 = local_12c0;
                  uStack_12b4 = local_12c0;
                  uStack_12b0 = local_12c0;
                  uStack_12ac = local_12c0;
                  uStack_12a8 = local_12c0;
                  uStack_12a4 = local_12c0;
                  uStack_129c = local_12a0;
                  uStack_1298 = local_12a0;
                  uStack_1294 = local_12a0;
                  uStack_1290 = local_12a0;
                  uStack_128c = local_12a0;
                  uStack_1288 = local_12a0;
                  uStack_1284 = local_12a0;
                  uStack_127c = local_1280;
                  uStack_1278 = local_1280;
                  uStack_1274 = local_1280;
                  uStack_1270 = local_1280;
                  uStack_126c = local_1280;
                  uStack_1268 = local_1280;
                  uStack_1264 = local_1280;
                  auVar41 = vpcmpeqd_avx2(local_1260,local_1260);
                  uStack_123c = (local_15d0.context)->instID[0];
                  local_1240 = uStack_123c;
                  uStack_1238 = uStack_123c;
                  uStack_1234 = uStack_123c;
                  uStack_1230 = uStack_123c;
                  uStack_122c = uStack_123c;
                  uStack_1228 = uStack_123c;
                  uStack_1224 = uStack_123c;
                  uStack_121c = (local_15d0.context)->instPrimID[0];
                  local_1220 = uStack_121c;
                  uStack_1218 = uStack_121c;
                  uStack_1214 = uStack_121c;
                  uStack_1210 = uStack_121c;
                  uStack_120c = uStack_121c;
                  uStack_1208 = uStack_121c;
                  uStack_1204 = uStack_121c;
                  local_15a0 = local_1340;
                  local_15d0.valid = (int *)local_15a0;
                  local_15d0.geometryUserPtr = pGVar25->userPtr;
                  local_15d0.ray = (RTCRayN *)local_1688;
                  local_15d0.hit = local_1320;
                  local_15d0.N = 8;
                  if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_1620._0_8_ = k;
                    local_1650._0_8_ = lVar27;
                    local_1630._0_8_ = puVar28;
                    local_1640._0_8_ = uVar29;
                    local_1660 = auVar67._0_16_;
                    auVar41 = ZEXT1632(auVar41._0_16_);
                    (*pGVar25->occlusionFilterN)(&local_15d0);
                    auVar67 = ZEXT1664(local_1660);
                    auVar41 = vpcmpeqd_avx2(auVar41,auVar41);
                    k = local_1620._0_8_;
                    pGVar25 = (Geometry *)local_1600._0_8_;
                    lVar27 = local_1650._0_8_;
                    puVar28 = (ulong *)local_1630._0_8_;
                    uVar29 = local_1640._0_8_;
                  }
                  auVar12 = vpcmpeqd_avx2(local_15a0,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar13 = auVar41 & ~auVar12;
                  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar13 >> 0x7f,0) == '\0') &&
                        (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar13 >> 0xbf,0) == '\0') &&
                      (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar13[0x1f]) {
                    auVar12 = auVar12 ^ auVar41;
                  }
                  else {
                    p_Var3 = context->args->filter;
                    if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                      local_1620._0_8_ = k;
                      local_1650._0_8_ = lVar27;
                      local_1630._0_8_ = puVar28;
                      local_1640._0_8_ = uVar29;
                      local_1660 = auVar67._0_16_;
                      auVar41 = ZEXT1632(auVar41._0_16_);
                      (*p_Var3)(&local_15d0);
                      auVar67 = ZEXT1664(local_1660);
                      auVar41 = vpcmpeqd_avx2(auVar41,auVar41);
                      k = local_1620._0_8_;
                      lVar27 = local_1650._0_8_;
                      puVar28 = (ulong *)local_1630._0_8_;
                      uVar29 = local_1640._0_8_;
                    }
                    auVar13 = vpcmpeqd_avx2(local_15a0,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar12 = auVar13 ^ auVar41;
                    auVar52._8_4_ = 0xff800000;
                    auVar52._0_8_ = 0xff800000ff800000;
                    auVar52._12_4_ = 0xff800000;
                    auVar52._16_4_ = 0xff800000;
                    auVar52._20_4_ = 0xff800000;
                    auVar52._24_4_ = 0xff800000;
                    auVar52._28_4_ = 0xff800000;
                    auVar41 = vblendvps_avx(auVar52,*(undefined1 (*) [32])(local_15d0.ray + 0x100),
                                            auVar13);
                    *(undefined1 (*) [32])(local_15d0.ray + 0x100) = auVar41;
                  }
                  if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar12 >> 0x7f,0) != '\0') ||
                        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar12 >> 0xbf,0) != '\0') ||
                      (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar12[0x1f] < '\0') goto LAB_0062426a;
                  *(int *)(local_1688 + k * 4 + 0x100) = auVar67._0_4_;
                  uVar20 = local_15f0._0_8_ ^ 1L << (local_1670._0_8_ & 0x3f);
                  lVar22 = local_1680;
                }
                pSVar26 = local_1610;
              } while (uVar20 != 0);
            }
          }
        }
        local_15e0 = local_15e0 + 1;
        auVar67 = ZEXT3264(local_1360);
        auVar77 = ZEXT3264(local_1380);
        auVar79 = ZEXT3264(local_13a0);
        auVar87 = ZEXT3264(local_1480);
        auVar89 = ZEXT3264(local_14a0);
      } while (local_15e0 != lVar27);
    }
LAB_00624254:
    bVar34 = puVar28 != &local_1200;
    if (!bVar34) {
      return bVar34;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }